

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O0

QString * __thiscall QXcbScreen::getName(QXcbScreen *this,xcb_randr_monitor_info_t *monitorInfo)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  qsizetype qVar4;
  QStringBuilder<QString,_char16_t> *in_RSI;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  int dotPos;
  QString *name;
  QByteArray displayName;
  QByteArray ba;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *this_00;
  undefined4 in_stack_fffffffffffffed0;
  uint3 in_stack_fffffffffffffed4;
  uint uVar6;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *pQVar7;
  QXcbBasicConnection *in_stack_fffffffffffffef0;
  QByteArray local_c0;
  char *local_a8;
  storage_type *local_a0;
  undefined1 local_90 [24];
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  long local_8;
  xcb_atom_t atom;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = (uint)in_stack_fffffffffffffed4;
  (in_RDI->a).a.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->a).a.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->a).a.d.size = -0x5555555555555556;
  this_00 = in_RDI;
  pQVar7 = in_RDI;
  QString::QString((QString *)0x1cef4b);
  atom = (xcb_atom_t)((ulong)pQVar7 >> 0x20);
  local_78 = 0xaaaaaaaaaaaaaaaa;
  local_70 = 0xaaaaaaaaaaaaaaaa;
  local_68 = 0xaaaaaaaaaaaaaaaa;
  QXcbObject::connection((QXcbObject *)&(in_RSI->a).d.size);
  QXcbBasicConnection::atomName(in_stack_fffffffffffffef0,atom);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x1cefaa);
  if (bVar1) {
    local_c0.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_c0.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    local_c0.d.size = -0x5555555555555556;
    QXcbObject::connection((QXcbObject *)&(in_RSI->a).d.size);
    pcVar3 = QXcbBasicConnection::displayName((QXcbBasicConnection *)0x1cf05b);
    QByteArray::QByteArray(&local_c0,pcVar3,-1);
    qVar4 = QByteArray::lastIndexOf
                      ((QByteArray *)in_RSI,(char)((ulong)this_00 >> 0x38),(qsizetype)in_RDI);
    if ((int)qVar4 != -1) {
      QByteArray::truncate((longlong)&local_c0);
    }
    QString::fromLocal8Bit<void>((QByteArray *)this_00);
    ::operator+(&in_RSI->a,(char16_t *)this_00);
    iVar2 = QXcbVirtualDesktop::number((QXcbVirtualDesktop *)in_RSI[1].a.d.d);
    QString::number((int)&stack0xfffffffffffffef0,iVar2);
    ::operator+(in_RSI,(QString *)this_00);
    ::QStringBuilder::operator_cast_to_QString(in_RDI);
    QString::operator=((QString *)this_00,(QString *)in_RDI);
    QString::~QString((QString *)0x1cf13b);
    QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder(this_00);
    QString::~QString((QString *)0x1cf152);
    QStringBuilder<QString,_char16_t>::~QStringBuilder
              ((QStringBuilder<QString,_char16_t> *)0x1cf15f);
    QString::~QString((QString *)0x1cf169);
    QByteArray::~QByteArray((QByteArray *)0x1cf176);
  }
  else {
    local_a8 = QByteArray::constData((QByteArray *)0x1cefbb);
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)CONCAT44(uVar6,in_stack_fffffffffffffed0),(char **)in_RSI);
    QVar5.m_data = local_a0;
    QVar5.m_size = (qsizetype)local_90;
    QString::fromLatin1(QVar5);
    QString::operator=((QString *)this_00,(QString *)in_RDI);
    QString::~QString((QString *)0x1cf013);
  }
  uVar6 = 0x1000000;
  QByteArray::~QByteArray((QByteArray *)0x1cf188);
  if ((uVar6 & 0x1000000) == 0) {
    QString::~QString((QString *)0x1cf198);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QXcbScreen::getName(xcb_randr_monitor_info_t *monitorInfo)
{
    QString name;
    QByteArray ba = connection()->atomName(monitorInfo->name);
    if (!ba.isEmpty()) {
        name = QString::fromLatin1(ba.constData());
    } else {
        QByteArray displayName = connection()->displayName();
        int dotPos = displayName.lastIndexOf('.');
        if (dotPos != -1)
            displayName.truncate(dotPos);
        name = QString::fromLocal8Bit(displayName) + u'.'
                + QString::number(m_virtualDesktop->number());
    }
    return name;
}